

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

int Abc_TtCofactorPermNaive(word *pTruth,int i,int nWords,int fSwapOnly)

{
  int iVar1;
  uint local_28;
  int Config;
  int fSwapOnly_local;
  int nWords_local;
  int i_local;
  word *pTruth_local;
  
  if (fSwapOnly == 0) {
    Abc_TtCopy(Abc_TtCofactorPermNaive::pCopy_1,pTruth,nWords,0);
    Abc_TtCopy(Abc_TtCofactorPermNaive::pBest,pTruth,nWords,0);
    Abc_TtFlip(Abc_TtCofactorPermNaive::pCopy_1,nWords,i);
    iVar1 = Abc_TtCompareRev(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,nWords)
    ;
    if (iVar1 == 1) {
      Abc_TtCopy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,nWords,0);
    }
    local_28 = (uint)(iVar1 == 1);
    Abc_TtFlip(Abc_TtCofactorPermNaive::pCopy_1,nWords,i + 1);
    iVar1 = Abc_TtCompareRev(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,nWords)
    ;
    if (iVar1 == 1) {
      Abc_TtCopy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,nWords,0);
      local_28 = 3;
    }
    Abc_TtFlip(Abc_TtCofactorPermNaive::pCopy_1,nWords,i);
    iVar1 = Abc_TtCompareRev(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,nWords)
    ;
    if (iVar1 == 1) {
      Abc_TtCopy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,nWords,0);
      local_28 = 2;
    }
    Abc_TtSwapAdjacent(Abc_TtCofactorPermNaive::pCopy_1,nWords,i);
    iVar1 = Abc_TtCompareRev(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,nWords)
    ;
    if (iVar1 == 1) {
      Abc_TtCopy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,nWords,0);
      local_28 = 6;
    }
    Abc_TtFlip(Abc_TtCofactorPermNaive::pCopy_1,nWords,i + 1);
    iVar1 = Abc_TtCompareRev(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,nWords)
    ;
    if (iVar1 == 1) {
      Abc_TtCopy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,nWords,0);
      local_28 = 7;
    }
    Abc_TtFlip(Abc_TtCofactorPermNaive::pCopy_1,nWords,i);
    iVar1 = Abc_TtCompareRev(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,nWords)
    ;
    if (iVar1 == 1) {
      Abc_TtCopy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,nWords,0);
      local_28 = 5;
    }
    Abc_TtFlip(Abc_TtCofactorPermNaive::pCopy_1,nWords,i + 1);
    iVar1 = Abc_TtCompareRev(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,nWords)
    ;
    if (iVar1 == 1) {
      Abc_TtCopy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,nWords,0);
      local_28 = 4;
    }
    Abc_TtSwapAdjacent(Abc_TtCofactorPermNaive::pCopy_1,nWords,i);
    iVar1 = Abc_TtEqual(pTruth,Abc_TtCofactorPermNaive::pCopy_1,nWords);
    if (iVar1 == 0) {
      __assert_fail("Abc_TtEqual( pTruth, pCopy, nWords )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauCanon.c"
                    ,0x2ce,"int Abc_TtCofactorPermNaive(word *, int, int, int)");
    }
    if (local_28 == 0) {
      pTruth_local._4_4_ = 0;
    }
    else {
      iVar1 = Abc_TtCompareRev(pTruth,Abc_TtCofactorPermNaive::pBest,nWords);
      if (iVar1 != 1) {
        __assert_fail("Abc_TtCompareRev(pTruth, pBest, nWords) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauCanon.c"
                      ,0x2d1,"int Abc_TtCofactorPermNaive(word *, int, int, int)");
      }
      Abc_TtCopy(pTruth,Abc_TtCofactorPermNaive::pBest,nWords,0);
      pTruth_local._4_4_ = local_28;
    }
  }
  else {
    Abc_TtCopy(Abc_TtCofactorPermNaive::pCopy,pTruth,nWords,0);
    Abc_TtSwapAdjacent(Abc_TtCofactorPermNaive::pCopy,nWords,i);
    iVar1 = Abc_TtCompareRev(pTruth,Abc_TtCofactorPermNaive::pCopy,nWords);
    if (iVar1 == 1) {
      Abc_TtCopy(pTruth,Abc_TtCofactorPermNaive::pCopy,nWords,0);
      pTruth_local._4_4_ = 4;
    }
    else {
      pTruth_local._4_4_ = 0;
    }
  }
  return pTruth_local._4_4_;
}

Assistant:

int Abc_TtCofactorPermNaive( word * pTruth, int i, int nWords, int fSwapOnly )
{
    if ( fSwapOnly )
    {
        static word pCopy[1024];
        Abc_TtCopy( pCopy, pTruth, nWords, 0 );
        Abc_TtSwapAdjacent( pCopy, nWords, i );
        if ( Abc_TtCompareRev(pTruth, pCopy, nWords) == 1 )
        {
            Abc_TtCopy( pTruth, pCopy, nWords, 0 );
            return 4;
        }
        return 0;
    }
    {
        static word pCopy[1024];
        static word pBest[1024];
        int Config = 0;
        // save two copies
        Abc_TtCopy( pCopy, pTruth, nWords, 0 );
        Abc_TtCopy( pBest, pTruth, nWords, 0 );
        // PXY
        // 001
        Abc_TtFlip( pCopy, nWords, i );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 1;
        // PXY
        // 011
        Abc_TtFlip( pCopy, nWords, i+1 );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 3;
        // PXY
        // 010
        Abc_TtFlip( pCopy, nWords, i );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 2;
        // PXY
        // 110
        Abc_TtSwapAdjacent( pCopy, nWords, i );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 6;
        // PXY
        // 111
        Abc_TtFlip( pCopy, nWords, i+1 );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 7;
        // PXY
        // 101
        Abc_TtFlip( pCopy, nWords, i );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 5;
        // PXY
        // 100
        Abc_TtFlip( pCopy, nWords, i+1 );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 4;
        // PXY
        // 000
        Abc_TtSwapAdjacent( pCopy, nWords, i );
        assert( Abc_TtEqual( pTruth, pCopy, nWords ) );
        if ( Config == 0 )
            return 0;
        assert( Abc_TtCompareRev(pTruth, pBest, nWords) == 1 );
        Abc_TtCopy( pTruth, pBest, nWords, 0 );
        return Config;
    }
}